

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O3

void __thiscall
HighsCliqueTable::addClique
          (HighsCliqueTable *this,HighsMipSolver *mipsolver,CliqueVar *cliquevars,
          HighsInt numcliquevars,bool equality,HighsInt origin)

{
  HighsDomain *this_00;
  pointer *ppCVar1;
  double *pdVar2;
  CliqueVar *pCVar3;
  HighsMipSolverData *pHVar4;
  pointer piVar5;
  _Base_ptr p_Var6;
  iterator iVar7;
  bool bVar8;
  HighsInt HVar9;
  _Rb_tree_node_base *p_Var10;
  _Rb_tree_node_base *p_Var11;
  _Rb_tree_node_base *p_Var12;
  CliqueVar CVar13;
  long lVar14;
  _Rb_tree_node_base *p_Var15;
  CliqueVar *pCVar16;
  CliqueVar *pCVar17;
  CliqueVar CVar18;
  ulong uVar19;
  CliqueVar *pCVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  _Rb_tree_node_base *p_Var25;
  long lVar26;
  _Rb_tree_node_base *p_Var27;
  ulong uVar28;
  _Rb_tree_node_base *p_Var29;
  ulong uVar30;
  byte bVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  HighsMipSolverData *local_98;
  
  pHVar4 = (mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  this_00 = &pHVar4->domain;
  if (numcliquevars == 0) {
LAB_0025e19d:
    bVar31 = 0;
LAB_0025e1a0:
    if ((bool)(origin == 0x7fffffff & (bVar31 ^ 1))) {
      return;
    }
  }
  else {
    uVar19 = (ulong)(uint)numcliquevars;
    uVar28 = 0;
    pCVar16 = cliquevars;
    do {
      resolveSubstitution(this,pCVar16);
      uVar30 = (ulong)((uint)cliquevars[uVar28] & 0x7fffffff);
      dVar32 = *(double *)
                (*(long *)&(pHVar4->domain).col_lower_.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl + uVar30 * 8)
      ;
      if (dVar32 == *(double *)
                     (*(long *)&(pHVar4->domain).col_upper_.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl +
                     uVar30 * 8)) {
        dVar33 = (double)((uint)cliquevars[uVar28] >> 0x1f);
        if ((dVar32 == dVar33) && (!NAN(dVar32) && !NAN(dVar33))) {
          if (uVar28 != 0) {
            uVar19 = uVar28;
            do {
              dVar32 = 1.0;
              if ((int)*cliquevars < 0) {
                dVar32 = 0.0;
              }
              uVar23 = (uint)*cliquevars & 0x7fffffff;
              dVar33 = *(double *)
                        (*(long *)&(pHVar4->domain).col_lower_.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl +
                        (ulong)uVar23 * 8);
              dVar34 = *(double *)
                        (*(long *)&(pHVar4->domain).col_upper_.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl +
                        (ulong)uVar23 * 8);
              HighsDomain::fixCol(this_00,uVar23,dVar32,(Reason)0xfffffffe);
              if ((pHVar4->domain).infeasible_ != false) {
                return;
              }
              if ((dVar33 != dVar34) || (NAN(dVar33) || NAN(dVar34))) {
                this->nfixings = this->nfixings + 1;
                iVar7._M_current =
                     (this->infeasvertexstack).
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (iVar7._M_current ==
                    (this->infeasvertexstack).
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
                  _M_realloc_insert<HighsCliqueTable::CliqueVar_const&>
                            ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                              *)&this->infeasvertexstack,iVar7,cliquevars);
                }
                else {
                  *iVar7._M_current = *cliquevars;
                  ppCVar1 = &(this->infeasvertexstack).
                             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppCVar1 = *ppCVar1 + 1;
                }
              }
              cliquevars = cliquevars + 1;
              uVar19 = uVar19 - 1;
            } while (uVar19 != 0);
          }
          if ((int)uVar28 + 1 < numcliquevars) {
            uVar28 = (numcliquevars - 1) - uVar28;
            do {
              pCVar16 = pCVar16 + 1;
              dVar32 = 1.0;
              if ((int)*pCVar16 < 0) {
                dVar32 = 0.0;
              }
              uVar23 = (uint)*pCVar16 & 0x7fffffff;
              dVar33 = *(double *)
                        (*(long *)&(pHVar4->domain).col_lower_.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl +
                        (ulong)uVar23 * 8);
              dVar34 = *(double *)
                        (*(long *)&(pHVar4->domain).col_upper_.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl +
                        (ulong)uVar23 * 8);
              HighsDomain::fixCol(this_00,uVar23,dVar32,(Reason)0xfffffffe);
              if ((pHVar4->domain).infeasible_ != false) {
                return;
              }
              if ((dVar33 != dVar34) || (NAN(dVar33) || NAN(dVar34))) {
                this->nfixings = this->nfixings + 1;
                iVar7._M_current =
                     (this->infeasvertexstack).
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (iVar7._M_current ==
                    (this->infeasvertexstack).
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
                  _M_realloc_insert<HighsCliqueTable::CliqueVar_const&>
                            ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                              *)&this->infeasvertexstack,iVar7,pCVar16);
                }
                else {
                  *iVar7._M_current = *pCVar16;
                  ppCVar1 = &(this->infeasvertexstack).
                             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppCVar1 = *ppCVar1 + 1;
                }
              }
              uVar23 = (int)uVar28 - 1;
              uVar28 = (ulong)uVar23;
            } while (uVar23 != 0);
          }
          goto LAB_0025e63a;
        }
      }
      uVar28 = uVar28 + 1;
      pCVar16 = pCVar16 + 1;
    } while (uVar19 != uVar28);
    if (numcliquevars < 0x65) {
      if (numcliquevars < 2) goto LAB_0025e19d;
      uVar28 = 1;
      uVar23 = 1;
      uVar30 = 0;
      bVar31 = 0;
      do {
        CVar13 = cliquevars[uVar30];
        dVar32 = *(double *)
                  (*(long *)&(pHVar4->domain).col_lower_.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl +
                  (ulong)((uint)CVar13 & 0x7fffffff) * 8);
        pdVar2 = (double *)
                 (*(long *)&(pHVar4->domain).col_upper_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl +
                 (ulong)((uint)CVar13 & 0x7fffffff) * 8);
        if ((dVar32 != *pdVar2) || (NAN(dVar32) || NAN(*pdVar2))) {
          piVar5 = (this->numcliquesvar).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar21 = uVar28;
          uVar22 = uVar23;
          if ((piVar5[(int)((int)CVar13 << 1 | (uint)((int)CVar13 < 0))] == 0) &&
             (piVar5[(int)((int)CVar13 << 1 | (uint)((int)((int)CVar13 + 0x80000000U) < 0))] == 0))
          {
            bVar31 = 1;
          }
          else {
            do {
              CVar13 = cliquevars[uVar21];
              dVar32 = *(double *)
                        (*(long *)&(pHVar4->domain).col_lower_.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl +
                        (ulong)((uint)CVar13 & 0x7fffffff) * 8);
              pdVar2 = (double *)
                       (*(long *)&(pHVar4->domain).col_upper_.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl +
                       (ulong)((uint)CVar13 & 0x7fffffff) * 8);
              if ((dVar32 != *pdVar2) || (NAN(dVar32) || NAN(*pdVar2))) {
                CVar18 = cliquevars[uVar30];
                if ((((uint)CVar18 ^ (uint)CVar13) & 0x7fffffff) != 0) {
                  HVar9 = findCommonCliqueId(this,&this->numNeighbourhoodQueries,CVar18,CVar13);
                  if (HVar9 != -1) goto LAB_0025e166;
                  CVar18 = cliquevars[uVar30];
                  CVar13 = cliquevars[uVar21];
                }
                bVar8 = processNewEdge(this,this_00,CVar18,CVar13);
                if ((pHVar4->domain).infeasible_ != false) {
                  return;
                }
                local_98 = (mipsolver->mipdata_)._M_t.
                           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                           .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
                if (((long)*(pointer *)((long)&(local_98->nodequeue).nodes + 8) -
                     *(long *)&(local_98->nodequeue).nodes.
                               super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>
                               ._M_impl >> 4) * -0x71c71c71c71c71c7 -
                    (((long)*(pointer *)((long)&(local_98->nodequeue).freeslots + 8) -
                      *(long *)&(local_98->nodequeue).freeslots.c.
                                super__Vector_base<long,_std::allocator<long>_> >> 3) +
                    (local_98->nodequeue).numSuboptimal) != 0) {
                  CVar13 = cliquevars[uVar30];
                  lVar26 = *(long *)((long)&(local_98->nodequeue).colLowerNodesPtr +
                                    (ulong)(~(uint)CVar13 >> 0x1f) * 8);
                  lVar14 = ((ulong)(uint)CVar13 & 0x7fffffff) * 0x38;
                  if (*(long *)(lVar26 + 0x30 + lVar14) != 0) {
                    CVar18 = cliquevars[uVar21];
                    lVar24 = ((ulong)(uint)CVar18 & 0x7fffffff) * 0x38 +
                             *(long *)((long)&(local_98->nodequeue).colLowerNodesPtr +
                                      (ulong)(~(uint)CVar18 >> 0x1f) * 8);
                    if (*(long *)(lVar24 + 0x30) != 0) {
                      lVar26 = lVar26 + lVar14;
                      p_Var15 = *(_Rb_tree_node_base **)(lVar26 + 0x18);
                      p_Var27 = (_Rb_tree_node_base *)(lVar26 + 0x10);
                      p_Var11 = p_Var27;
                      if (p_Var15 != (_Rb_tree_node_base *)0x0) {
                        dVar32 = (double)((uint)CVar13 >> 0x1f);
                        p_Var10 = p_Var15;
                        p_Var29 = p_Var27;
                        do {
                          if ((*(double *)(p_Var10 + 1) < dVar32) ||
                             ((lVar26 = 0x10, p_Var11 = p_Var10, *(double *)(p_Var10 + 1) <= dVar32
                              && ((long)p_Var10[1]._M_parent < 0x7fffffff)))) {
                            lVar26 = 0x18;
                            p_Var11 = p_Var29;
                          }
                          p_Var10 = *(_Rb_tree_node_base **)((long)&p_Var10->_M_color + lVar26);
                          p_Var12 = p_Var27;
                          p_Var29 = p_Var11;
                        } while (p_Var10 != (_Rb_tree_node_base *)0x0);
                        do {
                          lVar26 = 0x10;
                          p_Var27 = p_Var15;
                          if ((*(double *)(p_Var15 + 1) <= dVar32) &&
                             ((*(double *)(p_Var15 + 1) < dVar32 ||
                              ((long)p_Var15[1]._M_parent < 0x80000000)))) {
                            lVar26 = 0x18;
                            p_Var27 = p_Var12;
                          }
                          p_Var15 = *(_Rb_tree_node_base **)((long)&p_Var15->_M_color + lVar26);
                          p_Var12 = p_Var27;
                        } while (p_Var15 != (_Rb_tree_node_base *)0x0);
                      }
                      p_Var15 = *(_Rb_tree_node_base **)(lVar24 + 0x18);
                      if (p_Var15 != (_Rb_tree_node_base *)0x0) {
                        dVar32 = (double)((uint)CVar18 >> 0x1f);
                        p_Var10 = p_Var15;
                        p_Var29 = (_Rb_tree_node_base *)(lVar24 + 0x10);
                        do {
                          if ((*(double *)(p_Var10 + 1) < dVar32) ||
                             ((lVar26 = 0x10, p_Var12 = p_Var10, *(double *)(p_Var10 + 1) <= dVar32
                              && ((long)p_Var10[1]._M_parent < 0x7fffffff)))) {
                            lVar26 = 0x18;
                            p_Var12 = p_Var29;
                          }
                          p_Var10 = *(_Rb_tree_node_base **)((long)&p_Var10->_M_color + lVar26);
                          p_Var25 = (_Rb_tree_node_base *)(lVar24 + 0x10);
                          p_Var29 = p_Var12;
                        } while (p_Var10 != (_Rb_tree_node_base *)0x0);
                        do {
                          lVar26 = 0x10;
                          p_Var10 = p_Var15;
                          if ((*(double *)(p_Var15 + 1) <= dVar32) &&
                             ((*(double *)(p_Var15 + 1) < dVar32 ||
                              ((long)p_Var15[1]._M_parent < 0x80000000)))) {
                            lVar26 = 0x18;
                            p_Var10 = p_Var25;
                          }
                          p_Var15 = *(_Rb_tree_node_base **)((long)&p_Var15->_M_color + lVar26);
                          p_Var25 = p_Var10;
                        } while (p_Var15 != (_Rb_tree_node_base *)0x0);
                        if (((p_Var11 != p_Var27) && (p_Var12 != p_Var10)) &&
                           ((p_Var6 = p_Var11[1]._M_parent,
                            lVar26 = std::_Rb_tree_decrement(p_Var10),
                            (long)p_Var6 <= *(long *)(lVar26 + 0x28) ||
                            (p_Var6 = p_Var12[1]._M_parent,
                            lVar26 = std::_Rb_tree_decrement(p_Var27),
                            (long)p_Var6 <= *(long *)(lVar26 + 0x28))))) {
                          do {
                            p_Var6 = p_Var12[1]._M_parent;
                            if ((long)p_Var11[1]._M_parent < (long)p_Var6) {
                              p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
                            }
                            else if ((long)p_Var6 < (long)p_Var11[1]._M_parent) {
                              p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
                            }
                            else {
                              p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
                              p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
                              dVar33 = HighsNodeQueue::pruneNode
                                                 (&local_98->nodequeue,(long)(int)p_Var6);
                              local_98 = (mipsolver->mipdata_)._M_t.
                                         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                         .super__Head_base<0UL,_HighsMipSolverData_*,_false>.
                                         _M_head_impl;
                              dVar32 = (local_98->pruned_treeweight).hi;
                              dVar34 = dVar33 + dVar32;
                              (local_98->pruned_treeweight).hi = dVar34;
                              (local_98->pruned_treeweight).lo =
                                   (dVar32 - (dVar34 - dVar33)) +
                                   (dVar33 - (dVar34 - (dVar34 - dVar33))) +
                                   (local_98->pruned_treeweight).lo;
                            }
                          } while ((p_Var11 != p_Var27) && (p_Var12 != p_Var10));
                        }
                      }
                    }
                  }
                }
                bVar31 = 1;
                if (bVar8) {
                  uVar28 = 0;
                  do {
                    if ((uVar30 != uVar28) && (uVar22 != uVar28)) {
                      dVar32 = 1.0;
                      if ((int)*cliquevars < 0) {
                        dVar32 = 0.0;
                      }
                      uVar23 = (uint)*cliquevars & 0x7fffffff;
                      dVar33 = *(double *)
                                (*(long *)&(pHVar4->domain).col_lower_.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl + (ulong)uVar23 * 8);
                      dVar34 = *(double *)
                                (*(long *)&(pHVar4->domain).col_upper_.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl + (ulong)uVar23 * 8);
                      HighsDomain::fixCol(this_00,uVar23,dVar32,(Reason)0xfffffffe);
                      if ((pHVar4->domain).infeasible_ != false) {
                        return;
                      }
                      if ((dVar33 != dVar34) || (NAN(dVar33) || NAN(dVar34))) {
                        this->nfixings = this->nfixings + 1;
                        iVar7._M_current =
                             (this->infeasvertexstack).
                             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                        if (iVar7._M_current ==
                            (this->infeasvertexstack).
                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                          std::
                          vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                          ::_M_realloc_insert<HighsCliqueTable::CliqueVar_const&>
                                    ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                                      *)&this->infeasvertexstack,iVar7,cliquevars);
                        }
                        else {
                          *iVar7._M_current = *cliquevars;
                          ppCVar1 = &(this->infeasvertexstack).
                                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                          *ppCVar1 = *ppCVar1 + 1;
                        }
                      }
                    }
                    uVar28 = uVar28 + 1;
                    cliquevars = cliquevars + 1;
                  } while (uVar19 != uVar28);
                  goto LAB_0025e63a;
                }
              }
LAB_0025e166:
              uVar21 = uVar21 + 1;
              uVar22 = uVar22 + 1;
            } while (uVar21 != uVar19);
          }
        }
        uVar30 = uVar30 + 1;
        uVar28 = uVar28 + 1;
        uVar23 = uVar23 + 1;
      } while (uVar30 != numcliquevars - 1);
      goto LAB_0025e1a0;
    }
  }
  uVar19 = (ulong)numcliquevars;
  pCVar3 = cliquevars + uVar19;
  pCVar16 = cliquevars;
  pCVar20 = pCVar3;
  if (0 < (long)uVar19 >> 2) {
    lVar26 = *(long *)&(pHVar4->domain).col_lower_.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl;
    lVar14 = *(long *)&(pHVar4->domain).col_upper_.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl;
    uVar28 = uVar19 & 0x3ffffffffffffffc;
    lVar24 = ((long)uVar19 >> 2) + 1;
    pCVar16 = cliquevars + 2;
    do {
      dVar32 = *(double *)(lVar26 + (ulong)((uint)pCVar16[-2] & 0x7fffffff) * 8);
      pdVar2 = (double *)(lVar14 + (ulong)((uint)pCVar16[-2] & 0x7fffffff) * 8);
      if ((dVar32 == *pdVar2) && (!NAN(dVar32) && !NAN(*pdVar2))) {
        pCVar16 = pCVar16 + -2;
        goto LAB_0025e5be;
      }
      dVar32 = *(double *)(lVar26 + (ulong)((uint)pCVar16[-1] & 0x7fffffff) * 8);
      pdVar2 = (double *)(lVar14 + (ulong)((uint)pCVar16[-1] & 0x7fffffff) * 8);
      if ((dVar32 == *pdVar2) && (!NAN(dVar32) && !NAN(*pdVar2))) {
        pCVar16 = pCVar16 + -1;
        goto LAB_0025e5be;
      }
      dVar32 = *(double *)(lVar26 + (ulong)((uint)*pCVar16 & 0x7fffffff) * 8);
      pdVar2 = (double *)(lVar14 + (ulong)((uint)*pCVar16 & 0x7fffffff) * 8);
      if ((dVar32 == *pdVar2) && (!NAN(dVar32) && !NAN(*pdVar2))) goto LAB_0025e5be;
      dVar32 = *(double *)(lVar26 + (ulong)((uint)pCVar16[1] & 0x7fffffff) * 8);
      pdVar2 = (double *)(lVar14 + (ulong)((uint)pCVar16[1] & 0x7fffffff) * 8);
      if ((dVar32 == *pdVar2) && (!NAN(dVar32) && !NAN(*pdVar2))) {
        pCVar16 = pCVar16 + 1;
        goto LAB_0025e5be;
      }
      lVar24 = lVar24 + -1;
      pCVar16 = pCVar16 + 4;
    } while (1 < lVar24);
    uVar19 = (ulong)(numcliquevars & 3);
    pCVar16 = cliquevars + uVar28;
  }
  if (uVar19 == 3) {
    lVar26 = *(long *)&(pHVar4->domain).col_lower_.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl;
    lVar14 = *(long *)&(pHVar4->domain).col_upper_.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl;
    dVar32 = *(double *)(lVar26 + (ulong)((uint)*pCVar16 & 0x7fffffff) * 8);
    pdVar2 = (double *)(lVar14 + (ulong)((uint)*pCVar16 & 0x7fffffff) * 8);
    if ((dVar32 != *pdVar2) || (NAN(dVar32) || NAN(*pdVar2))) {
      pCVar16 = pCVar16 + 1;
      goto LAB_0025e49f;
    }
  }
  else {
    if (uVar19 == 2) {
      lVar26 = *(long *)&(pHVar4->domain).col_lower_.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl;
      lVar14 = *(long *)&(pHVar4->domain).col_upper_.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl;
LAB_0025e49f:
      dVar32 = *(double *)(lVar26 + (ulong)((uint)*pCVar16 & 0x7fffffff) * 8);
      pdVar2 = (double *)(lVar14 + (ulong)((uint)*pCVar16 & 0x7fffffff) * 8);
      if ((dVar32 == *pdVar2) && (!NAN(dVar32) && !NAN(*pdVar2))) goto LAB_0025e5be;
      pCVar16 = pCVar16 + 1;
    }
    else {
      if (uVar19 != 1) goto LAB_0025e605;
      lVar26 = *(long *)&(pHVar4->domain).col_lower_.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl;
      lVar14 = *(long *)&(pHVar4->domain).col_upper_.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl;
    }
    dVar32 = *(double *)(lVar26 + (ulong)((uint)*pCVar16 & 0x7fffffff) * 8);
    pdVar2 = (double *)(lVar14 + (ulong)((uint)*pCVar16 & 0x7fffffff) * 8);
    if ((dVar32 != *pdVar2) || (NAN(dVar32) || NAN(*pdVar2))) goto LAB_0025e605;
  }
LAB_0025e5be:
  pCVar17 = pCVar16;
  if (pCVar16 != pCVar3) {
    while (pCVar17 = pCVar17 + 1, pCVar20 = pCVar16, pCVar17 != pCVar3) {
      uVar19 = (ulong)((uint)*pCVar17 & 0x7fffffff);
      dVar32 = *(double *)
                (*(long *)&(pHVar4->domain).col_lower_.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl + uVar19 * 8)
      ;
      pdVar2 = (double *)
               (*(long *)&(pHVar4->domain).col_upper_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl + uVar19 * 8);
      if ((dVar32 != *pdVar2) || (NAN(dVar32) || NAN(*pdVar2))) {
        *pCVar16 = *pCVar17;
        pCVar16 = pCVar16 + 1;
      }
    }
  }
LAB_0025e605:
  HVar9 = (HighsInt)((ulong)((long)pCVar20 - (long)cliquevars) >> 2);
  if (HVar9 < 2) {
    return;
  }
  doAddClique(this,cliquevars,HVar9,equality,origin);
LAB_0025e63a:
  processInfeasibleVertices(this,this_00);
  return;
}

Assistant:

void HighsCliqueTable::addClique(const HighsMipSolver& mipsolver,
                                 CliqueVar* cliquevars, HighsInt numcliquevars,
                                 bool equality, HighsInt origin) {
  HighsDomain& globaldom = mipsolver.mipdata_->domain;
  mipsolver.mipdata_->debugSolution.checkClique(cliquevars, numcliquevars);
  for (HighsInt i = 0; i != numcliquevars; ++i) {
    resolveSubstitution(cliquevars[i]);
    if (globaldom.isFixed(cliquevars[i].col)) {
      if (cliquevars[i].val == globaldom.col_lower_[cliquevars[i].col]) {
        // column is fixed to 1, every other entry can be fixed to zero
        HighsInt k;
        for (k = 0; k < i; ++k) {
          bool wasfixed = globaldom.isFixed(cliquevars[k].col);
          globaldom.fixCol(cliquevars[k].col, double(1 - cliquevars[k].val));
          if (globaldom.infeasible()) return;
          if (!wasfixed) {
            ++nfixings;
            infeasvertexstack.push_back(cliquevars[k]);
          }
        }
        for (k = i + 1; k < numcliquevars; ++k) {
          bool wasfixed = globaldom.isFixed(cliquevars[k].col);
          globaldom.fixCol(cliquevars[k].col, double(1 - cliquevars[k].val));
          if (globaldom.infeasible()) return;
          if (!wasfixed) {
            ++nfixings;
            infeasvertexstack.push_back(cliquevars[k]);
          }
        }

        processInfeasibleVertices(globaldom);
        return;
      }
    }
  }

  if (numcliquevars <= 100) {
    bool hasNewEdge = false;

    // todo, sort new clique to allow log n lookup of membership in size by
    // binary search

    for (HighsInt i = 0; i < numcliquevars - 1; ++i) {
      if (globaldom.isFixed(cliquevars[i].col)) continue;
      if (numCliques(cliquevars[i]) == 0 &&
          numCliques(cliquevars[i].complement()) == 0) {
        hasNewEdge = true;
        continue;
      }

      for (HighsInt j = i + 1; j < numcliquevars; ++j) {
        if (globaldom.isFixed(cliquevars[j].col)) continue;

        if (haveCommonClique(cliquevars[i], cliquevars[j])) continue;
        // todo: Instead of haveCommonClique use findCommonClique. If the common
        // clique is smaller than this clique check if it is a subset of this
        // clique. If it is a subset remove the clique and iterate the process
        // until either a common clique that is not a subset of this one is
        // found, or no common clique exists anymore in which case we proceed
        // with the code below and set hasNewEdge to true

        hasNewEdge = true;

        bool iscover = processNewEdge(globaldom, cliquevars[i], cliquevars[j]);
        if (globaldom.infeasible()) return;

        if (!mipsolver.mipdata_->nodequeue.empty()) {
          const auto& v1Nodes =
              cliquevars[i].val == 1
                  ? mipsolver.mipdata_->nodequeue.getUpNodes(cliquevars[i].col)
                  : mipsolver.mipdata_->nodequeue.getDownNodes(
                        cliquevars[i].col);
          const auto& v2Nodes =
              cliquevars[j].val == 1
                  ? mipsolver.mipdata_->nodequeue.getUpNodes(cliquevars[j].col)
                  : mipsolver.mipdata_->nodequeue.getDownNodes(
                        cliquevars[j].col);

          if (!v1Nodes.empty() && !v2Nodes.empty()) {
            // general integer variables can become binary during the search
            // and the cliques might be discovered. That means we need to take
            // care here, since the set of nodes branched upwards or downwards
            // are not necessarily containing domain changes setting the
            // variables to the corresponding clique value but could be
            // redundant bound changes setting the upper bound to u >= 1 or the
            // lower bound to l <= 0.

            // itV1 will point to the first node where v1 is fixed to val and
            // endV1 to the end of the range of such nodes. Same for itV2/endV2
            // with v2.
            auto itV1 = v1Nodes.lower_bound(
                std::make_pair(double(cliquevars[i].val), kHighsIInf));
            auto endV1 = v1Nodes.upper_bound(
                std::make_pair(double(cliquevars[i].val), kHighsIInf));
            auto itV2 = v2Nodes.lower_bound(
                std::make_pair(double(cliquevars[j].val), kHighsIInf));
            auto endV2 = v2Nodes.upper_bound(
                std::make_pair(double(cliquevars[j].val), kHighsIInf));

            if (itV1 != endV1 && itV2 != endV2 &&
                (itV1->second <= std::prev(endV2)->second ||
                 itV2->second <= std::prev(endV1)->second)) {
              // node ranges overlap, check for nodes that can be pruned
              while (itV1 != endV1 && itV2 != endV2) {
                if (itV1->second < itV2->second) {
                  ++itV1;
                } else if (itV2->second < itV1->second) {
                  ++itV2;
                } else {
                  // if (!mipsolver.submip)
                  //   printf("node %d can be pruned\n", itV2->second);
                  HighsInt prunedNode = itV2->second;
                  ++itV1;
                  ++itV2;
                  mipsolver.mipdata_->pruned_treeweight +=
                      mipsolver.mipdata_->nodequeue.pruneNode(prunedNode);
                }
              }
            }
          }
        }

        if (iscover) {
          for (HighsInt k = 0; k != numcliquevars; ++k) {
            if (k == i || k == j) continue;

            bool wasfixed = globaldom.isFixed(cliquevars[k].col);
            globaldom.fixCol(cliquevars[k].col, double(1 - cliquevars[k].val));
            if (globaldom.infeasible()) return;
            if (!wasfixed) {
              ++nfixings;
              infeasvertexstack.push_back(cliquevars[k]);
            }
          }

          processInfeasibleVertices(globaldom);
          return;
        }
      }
    }
    if (!hasNewEdge && origin == kHighsIInf) return;
  }
  CliqueVar* unfixedend =
      std::remove_if(cliquevars, cliquevars + numcliquevars,
                     [&](CliqueVar v) { return globaldom.isFixed(v.col); });
  numcliquevars = unfixedend - cliquevars;
  if (numcliquevars < 2) return;

  doAddClique(cliquevars, numcliquevars, equality, origin);
  processInfeasibleVertices(globaldom);
}